

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int64_t __thiscall
aeron::archive::AeronArchive::pollForDescriptors
          (AeronArchive *this,int64_t correlationId,int32_t recordCount,
          RecordingDescriptorConsumer *consumer)

{
  bool bVar1;
  pointer pRVar2;
  element_type *this_00;
  AgentInvoker<aeron::ClientConductor> *this_01;
  __shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *this_03;
  ArchiveException *pAVar3;
  char *pcVar4;
  nfds_t __nfds;
  pollfd *__fds;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_e8;
  undefined1 local_da;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_79;
  string local_78;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_58;
  pollfd local_50;
  int32_t local_48;
  int local_44;
  int32_t remainingRecordCount;
  int32_t fragments;
  pollfd local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  int32_t existingRemainCount;
  RecordingDescriptorConsumer *consumer_local;
  int32_t recordCount_local;
  int64_t correlationId_local;
  AeronArchive *this_local;
  
  deadline.__d.__r._4_4_ = recordCount;
  _remainingRecordCount = (duration)std::chrono::_V2::system_clock::now();
  local_38 = (pollfd)std::chrono::operator+
                               ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)&remainingRecordCount,&this->messageTimeoutNs_);
  pRVar2 = std::
           unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
           ::operator->(&this->recordingDescriptorPoller_);
  __fds = (pollfd *)correlationId;
  RecordingDescriptorPoller::reset(pRVar2,correlationId,recordCount,consumer);
  while( true ) {
    do {
      pRVar2 = std::
               unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
               ::operator->(&this->recordingDescriptorPoller_);
      local_44 = RecordingDescriptorPoller::poll(pRVar2,__fds,__nfds,(int)consumer);
      pRVar2 = std::
               unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
               ::operator->(&this->recordingDescriptorPoller_);
      local_48 = RecordingDescriptorPoller::remainingRecordCount(pRVar2);
      pRVar2 = std::
               unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
               ::operator->(&this->recordingDescriptorPoller_);
      bVar1 = RecordingDescriptorPoller::isDispatchComplete(pRVar2);
      if (bVar1) {
        return (long)(recordCount - local_48);
      }
      if (deadline.__d.__r._4_4_ != local_48) {
        deadline.__d.__r._4_4_ = local_48;
        local_58.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        __fds = (pollfd *)&this->messageTimeoutNs_;
        local_50 = (pollfd)std::chrono::operator+
                                     (&local_58,
                                      (duration<long,_std::ratio<1L,_1000000000L>_> *)__fds);
        local_38 = local_50;
      }
      this_00 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->aeron_);
      this_01 = Aeron::conductorAgentInvoker(this_00);
      concurrent::AgentInvoker<aeron::ClientConductor>::invoke(this_01);
    } while (0 < local_44);
    pRVar2 = std::
             unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
             ::operator->(&this->recordingDescriptorPoller_);
    this_02 = (__shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              RecordingDescriptorPoller::subscription(pRVar2);
    this_03 = std::
              __shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_02);
    bVar1 = Subscription::isConnected(this_03);
    if (!bVar1) break;
    local_e8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    __fds = &local_38;
    bVar1 = std::chrono::operator>
                      (&local_e8,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)__fds);
    if (bVar1) {
      pAVar3 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_128,correlationId);
      std::operator+(&local_108,"awaiting recording descriptors: correlationId=",&local_128);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_148,
                 "std::int64_t aeron::archive::AeronArchive::pollForDescriptors(std::int64_t, std::int32_t, RecordingDescriptorConsumer &&)"
                 ,&local_149);
      pcVar4 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                         );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,pcVar4,&local_171);
      ArchiveException::ArchiveException(pAVar3,&local_108,&local_148,&local_170,0x1b4);
      __cxa_throw(pAVar3,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
    }
    concurrent::YieldingIdleStrategy::idle((YieldingIdleStrategy *)&this->field_0x138);
  }
  local_da = 1;
  pAVar3 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"subscription to archive is not connected",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,
             "std::int64_t aeron::archive::AeronArchive::pollForDescriptors(std::int64_t, std::int32_t, RecordingDescriptorConsumer &&)"
             ,&local_b1);
  pcVar4 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,pcVar4,&local_d9);
  ArchiveException::ArchiveException(pAVar3,&local_78,&local_b0,&local_d8,0x1af);
  local_da = 0;
  __cxa_throw(pAVar3,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
}

Assistant:

std::int64_t AeronArchive::pollForDescriptors(std::int64_t correlationId, std::int32_t recordCount,
                                              RecordingDescriptorConsumer&& consumer) {
    std::int32_t existingRemainCount = recordCount;
    auto deadline = Clock::now() + messageTimeoutNs_;

    recordingDescriptorPoller_->reset(correlationId, recordCount, std::move(consumer));

    while (true) {
        std::int32_t fragments = recordingDescriptorPoller_->poll();
        std::int32_t remainingRecordCount = recordingDescriptorPoller_->remainingRecordCount();

        if (recordingDescriptorPoller_->isDispatchComplete()) {
            return recordCount - remainingRecordCount;
        }

        if (existingRemainCount != remainingRecordCount) {
            existingRemainCount = remainingRecordCount;
            deadline = Clock::now() + messageTimeoutNs_;
        }

        aeron_->conductorAgentInvoker().invoke();

        if (fragments > 0) {
            continue;
        }

        if (!recordingDescriptorPoller_->subscription()->isConnected()) {
            throw ArchiveException("subscription to archive is not connected", SOURCEINFO);
        }

        if (Clock::now() > deadline) {
            throw ArchiveException("awaiting recording descriptors: correlationId=" + std::to_string(correlationId),
                                   SOURCEINFO);
        }

        idleStrategy_.idle();
    }
}